

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O0

quint64 rawReadValue(int fd)

{
  ulong uVar1;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  qint64 r;
  char *ptr;
  size_t nread;
  read_format results;
  qint64 in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  ulong local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  for (local_38 = 0; local_38 < 0x18; local_38 = (long)in_stack_ffffffffffffffb8 + local_38) {
    in_stack_ffffffffffffffb8 =
         (void *)qt_safe_read((int)((ulong)&local_20 >> 0x20),in_stack_ffffffffffffffb8,
                              in_stack_ffffffffffffffb0);
    if ((long)in_stack_ffffffffffffffb8 < 0) {
      perror("QBenchmarkPerfEventsMeasurer::readValue: reading the results");
      exit(1);
    }
  }
  if (local_10 == local_18) {
    local_28 = local_20;
  }
  else {
    auVar3._8_4_ = (int)((ulong)local_20 >> 0x20);
    auVar3._0_8_ = local_20;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)((ulong)local_10 >> 0x20);
    auVar4._0_8_ = local_10;
    auVar4._12_4_ = 0x45300000;
    auVar5._8_4_ = (int)((ulong)local_18 >> 0x20);
    auVar5._0_8_ = local_18;
    auVar5._12_4_ = 0x45300000;
    dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)) *
            (((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) /
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)));
    uVar1 = (ulong)dVar2;
    local_28 = (undefined1 *)(uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (quint64)local_28;
  }
  __stack_chk_fail();
}

Assistant:

static quint64 rawReadValue(int fd)
{
    /* from the kernel docs:
     * struct read_format {
     *  { u64           value;
     *    { u64         time_enabled; } && PERF_FORMAT_TOTAL_TIME_ENABLED
     *    { u64         time_running; } && PERF_FORMAT_TOTAL_TIME_RUNNING
     *    { u64         id;           } && PERF_FORMAT_ID
     *  } && !PERF_FORMAT_GROUP
     */

    struct read_format {
        quint64 value;
        quint64 time_enabled;
        quint64 time_running;
    } results;

    size_t nread = 0;
    while (nread < sizeof results) {
        char *ptr = reinterpret_cast<char *>(&results);
        qint64 r = qt_safe_read(fd, ptr + nread, sizeof results - nread);
        if (r < 0) {
            perror("QBenchmarkPerfEventsMeasurer::readValue: reading the results");
            exit(1);
        }
        nread += quint64(r);
    }

    if (results.time_running == results.time_enabled)
        return results.value;

    // scale the results, though this shouldn't happen!
    return results.value * (double(results.time_running) / double(results.time_enabled));
}